

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc_data.cpp
# Opt level: O1

void __thiscall NPC_Data::UnloadShopDrop(NPC_Data *this)

{
  NPC_Citizenship *__ptr;
  
  std::
  vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
  ::_M_erase_at_end(&this->drops,
                    (this->drops).
                    super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
  ::_M_erase_at_end(&this->shop_trade,
                    (this->shop_trade).
                    super__Vector_base<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
  ::_M_erase_at_end(&this->shop_craft,
                    (this->shop_craft).
                    super__Vector_base<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
  ::_M_erase_at_end(&this->skill_learn,
                    (this->skill_learn).
                    super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this->drops_chance_total = 0.0;
  __ptr = (this->citizenship)._M_t.
          super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>._M_t.
          super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>.
          super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl;
  (this->citizenship)._M_t.
  super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>._M_t.
  super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>.
  super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl = (NPC_Citizenship *)0x0;
  if (__ptr != (NPC_Citizenship *)0x0) {
    std::default_delete<NPC_Citizenship>::operator()
              ((default_delete<NPC_Citizenship> *)&this->citizenship,__ptr);
    return;
  }
  return;
}

Assistant:

void NPC_Data::UnloadShopDrop()
{
	this->drops.clear();
	this->shop_trade.clear();
	this->shop_craft.clear();
	this->skill_learn.clear();

	this->drops_chance_total = 0.0;

	this->citizenship.reset();
}